

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmitterBeam::EmitterBeam(EmitterBeam *this)

{
  EmitterBeam *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmitterBeam_0032e9f8;
  this->m_ui8BeamDataLength = '\r';
  this->m_ui8EmitterBeamIDNumber = '\0';
  this->m_ui16BeamParamIndex = 0;
  FundamentalParameterData::FundamentalParameterData(&this->m_FundamentalParameterData);
  this->m_ui8BeamFunction = '\0';
  this->m_ui8NumTargetInTrackJamField = '\0';
  this->m_ui8HighDensityTrackJam = '\0';
  BeamStatus::BeamStatus(&this->m_BeamStatus);
  JammingTechnique::JammingTechnique(&this->m_JammingTechnique);
  memset(&this->m_vTrackJamTargets,0,0x18);
  std::
  vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ::vector(&this->m_vTrackJamTargets);
  return;
}

Assistant:

EmitterBeam::EmitterBeam() :
    DataTypeBase (),
    m_ui8BeamDataLength ( EMITTER_BEAM_SIZE / 4 ),
    m_ui8EmitterBeamIDNumber ( 0u ),
    m_ui16BeamParamIndex ( 0u ),
    m_FundamentalParameterData (),
    m_ui8BeamFunction ( 0u ),
    m_ui8NumTargetInTrackJamField ( 0u ),
    m_ui8HighDensityTrackJam ( 0u ),
#if DIS_VERSION < 7
    m_ui8Padding ( 0u ),
    m_ui32JammingModeSequence ( 0u ),
#elif DIS_VERSION > 6
    m_BeamStatus (),
    m_JammingTechnique (),
#endif
    m_vTrackJamTargets ()
{
}